

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_fill_mode_rates(AV1_COMMON *cm,ModeCosts *mode_costs,FRAME_CONTEXT *fc)

{
  int iVar1;
  void *__s;
  long in_RDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int s;
  int u;
  aom_cdf_prob *cdf_v;
  aom_cdf_prob *cdf_u;
  int *cost_v;
  int *cost_u;
  int joint_sign;
  int sign_cost [8];
  int j;
  int i;
  int local_78;
  int local_74;
  int *in_stack_ffffffffffffff90;
  aom_cdf_prob *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int local_4c;
  int local_48 [10];
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  AV1_COMMON *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 0x14; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  if ((local_8->current_frame).skip_mode_info.skip_mode_flag != 0) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0xd; local_20 = local_20 + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  av1_cost_tokens_from_cdf
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  for (local_1c = 0; local_1c < 0x16; local_1c = local_1c + 1) {
    iVar1 = av1_filter_intra_allowed_bsize(local_8,(BLOCK_SIZE)local_1c);
    if (iVar1 != 0) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  for (local_1c = 0; local_1c < 7; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  av1_cost_tokens_from_cdf
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
    __s = (void *)(local_10 + 0x2d98 + (long)local_4c * 0x80);
    in_stack_ffffffffffffffa0 = (int *)(local_10 + (long)local_4c * 0x80 + 0x2dd8);
    if ((local_4c + 1) * 0xb >> 5 == 0) {
      memset(__s,0,0x40);
    }
    else {
      in_stack_ffffffffffffff98 = (aom_cdf_prob *)(local_18 + 0x522c + (long)(local_4c + -2) * 0x22)
      ;
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    if (local_4c + 1 + ((local_4c + 1) * 0xb >> 5) * -3 == 0) {
      memset(in_stack_ffffffffffffffa0,0,0x40);
    }
    else {
      in_stack_ffffffffffffff90 =
           (int *)(local_18 + 0x522c +
                  (long)((local_4c + 1 + ((local_4c + 1) * 0xb >> 5) * -3) * 3 +
                         ((local_4c + 1) * 0xb >> 5) + -3) * 0x22);
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_74 = 0; local_74 < 0x10; local_74 = local_74 + 1) {
      *(int *)((long)__s + (long)local_74 * 4) =
           local_48[local_4c] + *(int *)((long)__s + (long)local_74 * 4);
    }
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  for (local_1c = 0; local_1c < 0x15; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_78 = 1; local_78 < 4; local_78 = local_78 + 1) {
      if (use_inter_ext_tx_for_txsize[local_78][local_1c] != 0) {
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    for (local_78 = 1; local_78 < 3; local_78 = local_78 + 1) {
      if (use_intra_ext_tx_for_txsize[local_78][local_1c] != 0) {
        for (local_20 = 0; local_20 < 0xd; local_20 = local_20 + 1) {
          av1_cost_tokens_from_cdf
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        }
      }
    }
  }
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  av1_cost_tokens_from_cdf
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  iVar1 = frame_is_intra_only(local_8);
  if (iVar1 == 0) {
    for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 0x16; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 0x16; local_1c = local_1c + 1) {
      iVar1 = av1_is_wedge_used((BLOCK_SIZE)local_1c);
      if (iVar1 != 0) {
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 0x16; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 3; local_1c < 0x16; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 3; local_1c < 0x16; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

void av1_fill_mode_rates(AV1_COMMON *const cm, ModeCosts *mode_costs,
                         FRAME_CONTEXT *fc) {
  int i, j;

  for (i = 0; i < PARTITION_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->partition_cost[i],
                             fc->partition_cdf[i], NULL);

  if (cm->current_frame.skip_mode_info.skip_mode_flag) {
    for (i = 0; i < SKIP_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->skip_mode_cost[i],
                               fc->skip_mode_cdfs[i], NULL);
    }
  }

  for (i = 0; i < SKIP_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->skip_txfm_cost[i],
                             fc->skip_txfm_cdfs[i], NULL);
  }

  for (i = 0; i < KF_MODE_CONTEXTS; ++i)
    for (j = 0; j < KF_MODE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->y_mode_costs[i][j],
                               fc->kf_y_cdf[i][j], NULL);

  for (i = 0; i < BLOCK_SIZE_GROUPS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->mbmode_cost[i], fc->y_mode_cdf[i],
                             NULL);
  for (i = 0; i < CFL_ALLOWED_TYPES; ++i)
    for (j = 0; j < INTRA_MODES; ++j)
      av1_cost_tokens_from_cdf(mode_costs->intra_uv_mode_cost[i][j],
                               fc->uv_mode_cdf[i][j], NULL);

  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,
                           fc->filter_intra_mode_cdf, NULL);
  for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
    if (av1_filter_intra_allowed_bsize(cm, i))
      av1_cost_tokens_from_cdf(mode_costs->filter_intra_cost[i],
                               fc->filter_intra_cdfs[i], NULL);
  }

  for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->switchable_interp_costs[i],
                             fc->switchable_interp_cdf[i], NULL);

  for (i = 0; i < PALATTE_BSIZE_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_y_size_cost[i],
                             fc->palette_y_size_cdf[i], NULL);
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_size_cost[i],
                             fc->palette_uv_size_cdf[i], NULL);
    for (j = 0; j < PALETTE_Y_MODE_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_mode_cost[i][j],
                               fc->palette_y_mode_cdf[i][j], NULL);
    }
  }

  for (i = 0; i < PALETTE_UV_MODE_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_mode_cost[i],
                             fc->palette_uv_mode_cdf[i], NULL);
  }

  for (i = 0; i < PALETTE_SIZES; ++i) {
    for (j = 0; j < PALETTE_COLOR_INDEX_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_color_cost[i][j],
                               fc->palette_y_color_index_cdf[i][j], NULL);
      av1_cost_tokens_from_cdf(mode_costs->palette_uv_color_cost[i][j],
                               fc->palette_uv_color_index_cdf[i][j], NULL);
    }
  }

  int sign_cost[CFL_JOINT_SIGNS];
  av1_cost_tokens_from_cdf(sign_cost, fc->cfl_sign_cdf, NULL);
  for (int joint_sign = 0; joint_sign < CFL_JOINT_SIGNS; joint_sign++) {
    int *cost_u = mode_costs->cfl_cost[joint_sign][CFL_PRED_U];
    int *cost_v = mode_costs->cfl_cost[joint_sign][CFL_PRED_V];
    if (CFL_SIGN_U(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_u, 0, CFL_ALPHABET_SIZE * sizeof(*cost_u));
    } else {
      const aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
      av1_cost_tokens_from_cdf(cost_u, cdf_u, NULL);
    }
    if (CFL_SIGN_V(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_v, 0, CFL_ALPHABET_SIZE * sizeof(*cost_v));
    } else {
      const aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
      av1_cost_tokens_from_cdf(cost_v, cdf_v, NULL);
    }
    for (int u = 0; u < CFL_ALPHABET_SIZE; u++)
      cost_u[u] += sign_cost[joint_sign];
  }

  for (i = 0; i < MAX_TX_CATS; ++i)
    for (j = 0; j < TX_SIZE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->tx_size_cost[i][j],
                               fc->tx_size_cdf[i][j], NULL);

  for (i = 0; i < TXFM_PARTITION_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->txfm_partition_cost[i],
                             fc->txfm_partition_cdf[i], NULL);
  }

  for (i = TX_4X4; i < EXT_TX_SIZES; ++i) {
    int s;
    for (s = 1; s < EXT_TX_SETS_INTER; ++s) {
      if (use_inter_ext_tx_for_txsize[s][i]) {
        av1_cost_tokens_from_cdf(
            mode_costs->inter_tx_type_costs[s][i], fc->inter_ext_tx_cdf[s][i],
            av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[1][s]]);
      }
    }
    for (s = 1; s < EXT_TX_SETS_INTRA; ++s) {
      if (use_intra_ext_tx_for_txsize[s][i]) {
        for (j = 0; j < INTRA_MODES; ++j) {
          av1_cost_tokens_from_cdf(
              mode_costs->intra_tx_type_costs[s][i][j],
              fc->intra_ext_tx_cdf[s][i][j],
              av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[0][s]]);
        }
      }
    }
  }
  for (i = 0; i < DIRECTIONAL_MODES; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->angle_delta_cost[i],
                             fc->angle_delta_cdf[i], NULL);
  }
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost, fc->intrabc_cdf, NULL);

  for (i = 0; i < SPATIAL_PREDICTION_PROBS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->spatial_pred_cost[i],
                             fc->seg.spatial_pred_seg_cdf[i], NULL);
  }

  for (i = 0; i < SEG_TEMPORAL_PRED_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->tmp_pred_cost[i], fc->seg.pred_cdf[i],
                             NULL);
  }

  if (!frame_is_intra_only(cm)) {
    for (i = 0; i < COMP_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_inter_cost[i],
                               fc->comp_inter_cdf[i], NULL);
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < SINGLE_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->single_ref_cost[i][j],
                                 fc->single_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < COMP_REF_TYPE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_ref_type_cost[i],
                               fc->comp_ref_type_cdf[i], NULL);
    }

    for (i = 0; i < UNI_COMP_REF_CONTEXTS; ++i) {
      for (j = 0; j < UNIDIR_COMP_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->uni_comp_ref_cost[i][j],
                                 fc->uni_comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < FWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_ref_cost[i][j],
                                 fc->comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < BWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_bwdref_cost[i][j],
                                 fc->comp_bwdref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < INTRA_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->intra_inter_cost[i],
                               fc->intra_inter_cdf[i], NULL);
    }

    for (i = 0; i < NEWMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->newmv_mode_cost[i], fc->newmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < GLOBALMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->zeromv_mode_cost[i],
                               fc->zeromv_cdf[i], NULL);
    }

    for (i = 0; i < REFMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->refmv_mode_cost[i], fc->refmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < DRL_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->drl_mode_cost0[i], fc->drl_cdf[i],
                               NULL);
    }
    for (i = 0; i < INTER_MODE_CONTEXTS; ++i)
      av1_cost_tokens_from_cdf(mode_costs->inter_compound_mode_cost[i],
                               fc->inter_compound_mode_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i)
      av1_cost_tokens_from_cdf(mode_costs->compound_type_cost[i],
                               fc->compound_type_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      if (av1_is_wedge_used(i)) {
        av1_cost_tokens_from_cdf(mode_costs->wedge_idx_cost[i],
                                 fc->wedge_idx_cdf[i], NULL);
      }
    }
    for (i = 0; i < BLOCK_SIZE_GROUPS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->interintra_cost[i],
                               fc->interintra_cdf[i], NULL);
      av1_cost_tokens_from_cdf(mode_costs->interintra_mode_cost[i],
                               fc->interintra_mode_cdf[i], NULL);
    }
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->wedge_interintra_cost[i],
                               fc->wedge_interintra_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost[i],
                               fc->motion_mode_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost1[i],
                               fc->obmc_cdf[i], NULL);
    }
    for (i = 0; i < COMP_INDEX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_idx_cost[i],
                               fc->compound_index_cdf[i], NULL);
    }
    for (i = 0; i < COMP_GROUP_IDX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_group_idx_cost[i],
                               fc->comp_group_idx_cdf[i], NULL);
    }
  }
}